

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O0

Var Js::JavascriptMap::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_32_4_0fe09f0a handler;
  bool bVar2;
  int n;
  CallFlags CVar3;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  RecyclableObject *constructor;
  RecyclableObject *local_190;
  RecyclableObject *local_140;
  RecyclableObject *local_d8;
  Var undefined;
  Var adderVar;
  RecyclableObject *adder;
  RecyclableObject *iter;
  Var iterable;
  JavascriptMap *mapObject;
  byte local_95;
  bool isCtorSuperCall;
  Var local_88;
  Var newTarget;
  undefined1 local_78 [8];
  AutoTagNativeLibraryEntry __tag;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x1e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  library = (JavascriptLibrary *)RecyclableObject::GetScriptContext(function);
  __tag.entry.next = (Entry *)ScriptContext::GetLibrary((ScriptContext *)library);
  newTarget = function_local;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_78,function,(CallInfo)function_local,L"Map",
             &stack0x00000000);
  local_88 = Arguments::GetNewTarget((Arguments *)&scriptContext);
  Arguments::Arguments((Arguments *)&mapObject,(Arguments *)&scriptContext);
  local_95 = Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&mapObject);
  iterable = (Var)0x0;
  CVar3 = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  if (CVar3 == CallFlags_None) {
    JavascriptError::ThrowTypeErrorVar((ScriptContext *)library,-0x7ff5ec04,L"Map");
  }
  iterable = JavascriptLibrary::CreateMap((JavascriptLibrary *)__tag.entry.next);
  if ((JavascriptMap *)iterable == (JavascriptMap *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x31,"(mapObject != nullptr)","mapObject != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    local_140 = JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)__tag.entry.next);
  }
  else {
    local_140 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  iter = local_140;
  if (*(char *)((long)iterable + 0x38) != '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x38,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    JavascriptError::ThrowTypeErrorVar((ScriptContext *)library,-0x7ff5ec06,L"Map");
  }
  adder = (RecyclableObject *)0x0;
  adderVar = (Var)0x0;
  BVar4 = JavascriptConversion::CheckObjectCoercible(local_140,(ScriptContext *)library);
  if (BVar4 != 0) {
    adder = Js::JavascriptOperators::GetIterator(iter,(ScriptContext *)library,false);
    undefined = Js::JavascriptOperators::GetPropertyNoCache
                          ((RecyclableObject *)iterable,0x19b,(ScriptContext *)library);
    bVar2 = JavascriptConversion::IsCallable(undefined);
    if (!bVar2) {
      JavascriptError::ThrowTypeError((ScriptContext *)library,-0x7ff5ec76,(PCWSTR)0x0);
    }
    adderVar = VarTo<Js::RecyclableObject>(undefined);
  }
  if (adder != (RecyclableObject *)0x0) {
    local_d8 = JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)__tag.entry.next);
    handler.undefined = &local_d8;
    handler.scriptContext = (ScriptContext **)&library;
    handler.adder = (RecyclableObject **)&adderVar;
    handler.mapObject = (JavascriptMap **)&iterable;
    Js::JavascriptOperators::
    DoIteratorStepAndValue<Js::JavascriptMap::NewInstance(Js::RecyclableObject*,Js::CallInfo,___)::__0>
              (adder,(ScriptContext *)library,handler);
  }
  if ((local_95 & 1) == 0) {
    local_190 = (RecyclableObject *)iterable;
  }
  else {
    constructor = VarTo<Js::RecyclableObject>(local_88);
    local_190 = Js::JavascriptOperators::OrdinaryCreateFromConstructor
                          (constructor,(RecyclableObject *)iterable,(DynamicObject *)0x0,
                           (ScriptContext *)library);
  }
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_78);
  return local_190;
}

Assistant:

Var JavascriptMap::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Map"));

    Var newTarget = args.GetNewTarget();
    bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);
    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Map, scriptContext);

    JavascriptMap* mapObject = nullptr;

    if (callInfo.Flags & CallFlags_New)
    {
        mapObject = library->CreateMap();
    }
    else
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map"), _u("Map"));
    }
    Assert(mapObject != nullptr);

    Var iterable = (args.Info.Count > 1) ? args[1] : library->GetUndefined();

    // REVIEW: This condition seems impossible?
    if (mapObject->kind != MapKind::EmptyMap)
    {
        Assert(UNREACHED);
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_ObjectIsAlreadyInitialized, _u("Map"), _u("Map"));
    }

    RecyclableObject* iter = nullptr;
    RecyclableObject* adder = nullptr;

    if (JavascriptConversion::CheckObjectCoercible(iterable, scriptContext))
    {
        iter = JavascriptOperators::GetIterator(iterable, scriptContext);
        Var adderVar = JavascriptOperators::GetPropertyNoCache(mapObject, PropertyIds::set, scriptContext);
        if (!JavascriptConversion::IsCallable(adderVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }
        adder = VarTo<RecyclableObject>(adderVar);
    }

    if (iter != nullptr)
    {
        Var undefined = library->GetUndefined();

        JavascriptOperators::DoIteratorStepAndValue(iter, scriptContext, [&](Var nextItem) {
            if (!JavascriptOperators::IsObject(nextItem))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
            }

            RecyclableObject* obj = VarTo<RecyclableObject>(nextItem);

            Var key = nullptr, value = nullptr;

            if (!JavascriptOperators::GetItem(obj, 0u, &key, scriptContext))
            {
                key = undefined;
            }

            if (!JavascriptOperators::GetItem(obj, 1u, &value, scriptContext))
            {
                value = undefined;
            }

            // CONSIDER: if adder is the default built-in, fast path it and skip the JS call?
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                CALL_FUNCTION(scriptContext->GetThreadContext(), adder, CallInfo(CallFlags_Value, 3), mapObject, key, value);
            }
            END_SAFE_REENTRANT_CALL
        });
    }

    return isCtorSuperCall ?
        JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), mapObject, nullptr, scriptContext) :
        mapObject;
}